

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool __thiscall crnlib::rg_etc1::etc1_optimizer::compute(etc1_optimizer *this)

{
  potential_solution *trial_solution;
  potential_solution *pBest_solution;
  undefined4 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  params *ppVar9;
  results *prVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [16];
  uint5 uVar21;
  undefined1 auVar22 [15];
  unkuint9 Var23;
  undefined1 auVar24 [11];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [13];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  bool bVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  byte bVar42;
  uint uVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  uint refinement_trial;
  int iVar48;
  uint uVar49;
  float fVar50;
  int iVar51;
  uint uVar52;
  int iVar55;
  int iVar57;
  int iVar58;
  undefined1 auVar53 [16];
  uint uVar56;
  undefined1 auVar54 [16];
  ushort uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar68;
  float fVar69;
  undefined1 auVar64 [16];
  float fVar63;
  float fVar70;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  color_quad_u8 base_color;
  etc1_solution_coordinates coords1;
  etc1_solution_coordinates coords;
  
  uVar5 = this->m_pParams->m_num_src_pixels;
  uVar6 = this->m_pParams->m_scan_delta_size;
  trial_solution = &this->m_trial_solution;
  pBest_solution = &this->m_best_solution;
  fVar50 = (float)uVar5;
  uVar38 = 0;
  if (0 < (int)uVar6) {
    uVar38 = (ulong)uVar6;
  }
  for (uVar40 = 0; uVar40 != uVar38; uVar40 = uVar40 + 1) {
    iVar7 = this->m_pParams->m_pScan_deltas[uVar40];
    uVar32 = this->m_bb + iVar7;
    if (-1 < (int)uVar32) {
      if (this->m_limit < (int)uVar32) break;
      uVar33 = 0xff;
      if (uVar32 < 0xff) {
        uVar33 = uVar32;
      }
      for (uVar39 = 0; uVar39 != uVar6; uVar39 = uVar39 + 1) {
        iVar8 = this->m_pParams->m_pScan_deltas[uVar39];
        uVar34 = this->m_bg + iVar8;
        if (-1 < (int)uVar34) {
          if (this->m_limit < (int)uVar34) break;
          uVar35 = 0xff;
          if (uVar34 < 0xff) {
            uVar35 = uVar34;
          }
          for (uVar41 = 0; uVar41 != uVar6; uVar41 = uVar41 + 1) {
            ppVar9 = this->m_pParams;
            iVar36 = ppVar9->m_pScan_deltas[uVar41];
            uVar49 = this->m_br + iVar36;
            if (-1 < (int)uVar49) {
              if (this->m_limit < (int)uVar49) break;
              uVar37 = 0xff;
              if (uVar49 < 0xff) {
                uVar37 = uVar49;
              }
              coords.m_color4 = ppVar9->m_use_color4;
              coords.m_unscaled_color.field_0.field_0.r = (component_t)uVar37;
              coords.m_unscaled_color.field_0.field_0.g = (component_t)uVar35;
              coords.m_unscaled_color.field_0.field_0.b = (component_t)uVar33;
              coords.m_unscaled_color.field_0.field_0.a = 0xff;
              coords.m_inten_table = 0;
              if ((ppVar9->super_etc1_pack_params).m_quality == cHighQuality) {
                bVar30 = evaluate_solution(this,&coords,trial_solution,pBest_solution);
              }
              else {
                bVar30 = evaluate_solution_fast(this,&coords,trial_solution,pBest_solution);
              }
              if (bVar30 != false) {
                bVar30 = iVar36 == 0 && (iVar8 == 0 && iVar7 == 0);
                iVar36 = bVar30 + 2 + (uint)bVar30;
                if ((this->m_pParams->super_etc1_pack_params).m_quality == cLowQuality) {
                  iVar36 = 2;
                }
                for (iVar48 = 0; iVar48 != iVar36; iVar48 = iVar48 + 1) {
                  uVar37 = (this->m_best_solution).m_coords.m_inten_table;
                  etc1_solution_coordinates::get_scaled_color
                            ((etc1_solution_coordinates *)&base_color);
                  iVar51 = 0;
                  iVar55 = 0;
                  iVar57 = 0;
                  iVar58 = 0;
                  bVar42 = base_color.field_0._2_1_;
                  uVar59 = (ushort)base_color.field_0._0_1_;
                  auVar18[0xc] = base_color.field_0._3_1_;
                  auVar18._0_12_ = ZEXT712(0);
                  uVar21 = CONCAT32(auVar18._10_3_,(ushort)bVar42);
                  auVar27._5_8_ = 0;
                  auVar27._0_5_ = uVar21;
                  lVar44 = 0;
                  iVar31 = 0;
                  while( true ) {
                    if (uVar5 == (uint)lVar44) break;
                    iVar45 = (&g_etc1_inten_tables)
                             [(ulong)uVar37 * 4 + (ulong)(this->m_best_solution).m_selectors[lVar44]
                             ];
                    iVar46 = iVar45 + (uint)uVar59;
                    if (0xfe < iVar46) {
                      iVar46 = 0xff;
                    }
                    if (iVar46 < 1) {
                      iVar46 = 0;
                    }
                    iVar47 = iVar45 + (uint)(ushort)base_color.field_0._1_1_;
                    if (0xfe < iVar47) {
                      iVar47 = 0xff;
                    }
                    if (iVar47 < 1) {
                      iVar47 = 0;
                    }
                    iVar45 = iVar45 + (uint)bVar42;
                    if (0xfe < iVar45) {
                      iVar45 = 0xff;
                    }
                    if (iVar45 < 1) {
                      iVar45 = 0;
                    }
                    iVar57 = iVar57 - (int)uVar21;
                    iVar58 = iVar58 - (uint)(uint3)(auVar18._10_3_ >> 0x10);
                    iVar51 = (iVar51 - (uint)uVar59) + iVar46;
                    iVar55 = (iVar55 - (int)CONCAT72(SUB137(auVar27 << 0x40,6),
                                                     (ushort)base_color.field_0._1_1_)) + iVar47;
                    iVar31 = (iVar31 - (uint)bVar42) + iVar45;
                    lVar44 = lVar44 + 1;
                  }
                  auVar72._0_4_ = -(uint)(iVar51 == 0);
                  auVar72._4_4_ = -(uint)(iVar51 == 0);
                  auVar72._8_4_ = -(uint)(iVar55 == 0);
                  auVar72._12_4_ = -(uint)(iVar55 == 0);
                  uVar37 = movmskpd((uint)uVar59,auVar72);
                  if (((((uVar37 ^ 3) & 1) == 0) && ((byte)((byte)(uVar37 ^ 3) >> 1) == 0)) &&
                     (iVar31 == 0)) break;
                  auVar71._0_4_ = (float)iVar51;
                  auVar71._4_4_ = (float)iVar55;
                  auVar71._8_4_ = (float)iVar57;
                  auVar71._12_4_ = (float)iVar58;
                  auVar20._4_4_ = fVar50;
                  auVar20._0_4_ = fVar50;
                  auVar20._8_4_ = fVar50;
                  auVar20._12_4_ = fVar50;
                  auVar72 = divps(auVar71,auVar20);
                  uVar37 = this->m_limit;
                  fVar62 = (float)(int)uVar37;
                  uVar2 = *(undefined8 *)(this->m_avg_color).m_s;
                  auVar64._0_4_ = fVar62 * ((float)uVar2 - auVar72._0_4_);
                  auVar64._4_4_ = fVar62 * ((float)((ulong)uVar2 >> 0x20) - auVar72._4_4_);
                  auVar64._8_4_ = fVar62 * (0.0 - auVar72._8_4_);
                  auVar64._12_4_ = fVar62 * (0.0 - auVar72._12_4_);
                  auVar72 = divps(auVar64,_DAT_0018cee0);
                  fVar63 = auVar72._0_4_ + 0.5;
                  fVar68 = auVar72._4_4_ + 0.5;
                  fVar69 = auVar72._8_4_ + 0.0;
                  fVar70 = auVar72._12_4_ + 0.0;
                  auVar66._0_4_ = (int)fVar63;
                  auVar66._4_4_ = (int)fVar68;
                  auVar66._8_4_ = (int)fVar69;
                  auVar66._12_4_ = (int)fVar70;
                  auVar60._0_4_ = auVar66._0_4_ >> 0x1f;
                  auVar60._4_4_ = auVar66._4_4_ >> 0x1f;
                  auVar60._8_4_ = auVar66._8_4_ >> 0x1f;
                  auVar60._12_4_ = auVar66._12_4_ >> 0x1f;
                  auVar65._0_4_ = (int)(fVar63 - 2.1474836e+09);
                  auVar65._4_4_ = (int)(fVar68 - 2.1474836e+09);
                  auVar65._8_4_ = (int)(fVar69 - 2.1474836e+09);
                  auVar65._12_4_ = (int)(fVar70 - 2.1474836e+09);
                  auVar66 = auVar65 & auVar60 | auVar66;
                  auVar61._4_4_ = uVar37;
                  auVar61._0_4_ = uVar37;
                  auVar61._8_8_ = 0;
                  auVar73._0_4_ = -(uint)(auVar66._0_4_ < (int)uVar37);
                  auVar73._4_4_ = -(uint)(auVar66._4_4_ < (int)uVar37);
                  auVar73._8_4_ = -(uint)(auVar66._8_4_ < 0);
                  auVar73._12_4_ = -(uint)(auVar66._12_4_ < 0);
                  auVar53._0_4_ = -(uint)(auVar66._0_4_ < 0);
                  auVar53._4_4_ = -(uint)(auVar66._4_4_ < 0);
                  auVar53._8_4_ = -(uint)(auVar66._8_4_ < 0);
                  auVar53._12_4_ = -(uint)(auVar66._12_4_ < 0);
                  auVar72 = ~auVar53 & (~auVar73 & auVar61 | auVar66 & auVar73);
                  uVar52 = auVar72._0_4_;
                  uVar56 = auVar72._4_4_;
                  uVar43 = (uint)(long)((((this->m_avg_color).m_s[2] - (float)iVar31 / fVar50) *
                                        fVar62) / 255.0 + 0.5);
                  if ((int)uVar43 < (int)uVar37) {
                    uVar37 = uVar43;
                  }
                  if ((int)uVar43 < 0) {
                    uVar37 = 0;
                  }
                  if (((uVar49 == uVar52) && (uVar34 == uVar56)) && (uVar32 == uVar37)) break;
                  uVar3._0_4_ = (this->m_best_solution).m_coords.m_unscaled_color;
                  uVar3._4_4_ = (this->m_best_solution).m_coords.m_inten_table;
                  auVar11._8_6_ = 0;
                  auVar11._0_8_ = uVar3;
                  auVar11[0xe] = (char)((uint)uVar3._4_4_ >> 0x18);
                  auVar13._8_4_ = 0;
                  auVar13._0_8_ = uVar3;
                  auVar13[0xc] = (char)((uint)uVar3._4_4_ >> 0x10);
                  auVar13._13_2_ = auVar11._13_2_;
                  auVar14._8_4_ = 0;
                  auVar14._0_8_ = uVar3;
                  auVar14._12_3_ = auVar13._12_3_;
                  auVar15._8_2_ = 0;
                  auVar15._0_8_ = uVar3;
                  auVar15[10] = (char)((uint)uVar3._4_4_ >> 8);
                  auVar15._11_4_ = auVar14._11_4_;
                  auVar16._8_2_ = 0;
                  auVar16._0_8_ = uVar3;
                  auVar16._10_5_ = auVar15._10_5_;
                  auVar17[8] = (char)uVar3._4_4_;
                  auVar17._0_8_ = uVar3;
                  auVar17._9_6_ = auVar16._9_6_;
                  auVar22._7_8_ = 0;
                  auVar22._0_7_ = auVar17._8_7_;
                  Var23 = CONCAT81(SUB158(auVar22 << 0x40,7),(char)((uint)(undefined4)uVar3 >> 0x18)
                                  );
                  auVar28._9_6_ = 0;
                  auVar28._0_9_ = Var23;
                  auVar24._1_10_ = SUB1510(auVar28 << 0x30,5);
                  auVar24[0] = (char)((uint)(undefined4)uVar3 >> 0x10);
                  auVar29._11_4_ = 0;
                  auVar29._0_11_ = auVar24;
                  auVar25._1_12_ = SUB1512(auVar29 << 0x20,3);
                  auVar25[0] = (char)((uint)(undefined4)uVar3 >> 8);
                  uVar59 = CONCAT11(0,(byte)(undefined4)uVar3);
                  auVar19._2_13_ = auVar25;
                  auVar19._0_2_ = uVar59;
                  auVar12._10_2_ = 0;
                  auVar12._0_10_ = auVar19._0_10_;
                  auVar12._12_2_ = (short)Var23;
                  auVar26._2_4_ = auVar12._10_4_;
                  auVar26._0_2_ = auVar24._0_2_;
                  auVar26._6_8_ = 0;
                  uVar43 = (uint)CONCAT82(SUB148(auVar26 << 0x40,6),auVar25._0_2_);
                  auVar67._0_4_ = -(uint)(uVar52 == uVar59);
                  auVar67._4_4_ = -(uint)(uVar52 == uVar59);
                  auVar67._8_4_ = -(uint)(uVar56 == uVar43);
                  auVar67._12_4_ = -(uint)(uVar56 == uVar43);
                  uVar43 = movmskpd(0,auVar67);
                  if ((((uVar43 & 1) != 0) &&
                      (bVar42 = (byte)uVar43 >> 1, uVar43 = CONCAT31((int3)(uVar43 >> 8),bVar42),
                      bVar42 != 0)) &&
                     (bVar42 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b,
                     uVar43 = (uint)bVar42, uVar37 == bVar42)) break;
                  uVar1 = this->m_br;
                  uVar4 = this->m_bg;
                  auVar54._4_4_ = -(uint)(uVar1 == uVar52);
                  auVar54._0_4_ = -(uint)(uVar1 == uVar52);
                  auVar54._8_4_ = -(uint)(uVar4 == uVar56);
                  auVar54._12_4_ = -(uint)(uVar4 == uVar56);
                  uVar43 = movmskpd(uVar43,auVar54);
                  if ((((uVar43 & 1) != 0) && ((byte)((byte)uVar43 >> 1) != 0)) &&
                     (this->m_bb == uVar37)) break;
                  if ((int)uVar52 < 1) {
                    uVar52 = 0;
                  }
                  if (0xfe < (int)uVar52) {
                    uVar52 = 0xff;
                  }
                  coords1.m_color4 = this->m_pParams->m_use_color4;
                  if ((int)uVar56 < 1) {
                    uVar56 = 0;
                  }
                  coords1.m_unscaled_color.field_0.field_0.r = (component_t)uVar52;
                  coords1.m_unscaled_color.field_0.field_0.g = (component_t)uVar56;
                  if (0xfe < (int)uVar56) {
                    coords1.m_unscaled_color.field_0.field_0.g = 0xff;
                  }
                  if ((int)uVar37 < 1) {
                    uVar37 = 0;
                  }
                  coords1.m_unscaled_color.field_0.field_0.b = (component_t)uVar37;
                  if (0xfe < (int)uVar37) {
                    coords1.m_unscaled_color.field_0.field_0.b = 0xff;
                  }
                  coords1.m_unscaled_color.field_0.field_0.a = 0xff;
                  coords1.m_inten_table = 0;
                  if ((this->m_pParams->super_etc1_pack_params).m_quality == cHighQuality) {
                    bVar30 = evaluate_solution(this,&coords1,trial_solution,pBest_solution);
                  }
                  else {
                    bVar30 = evaluate_solution_fast(this,&coords1,trial_solution,pBest_solution);
                  }
                  if (bVar30 == false) break;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar30 = (this->m_best_solution).m_valid;
  if (bVar30 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    prVar10 = this->m_pResult;
    prVar10->m_error = (this->m_best_solution).m_error;
    (prVar10->m_block_color_unscaled).field_0 =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0;
    prVar10 = this->m_pResult;
    prVar10->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    prVar10->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(prVar10->m_pSelectors,(this->m_best_solution).m_selectors,(ulong)uVar5);
    this->m_pResult->m_n = uVar5;
  }
  return bVar30;
}

Assistant:

bool etc1_optimizer::compute()
        {
            const uint n = m_pParams->m_num_src_pixels;
            const int scan_delta_size = m_pParams->m_scan_delta_size;

            // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
            // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
            for (int zdi = 0; zdi < scan_delta_size; zdi++)
            {
                const int zd = m_pParams->m_pScan_deltas[zdi];
                const int mbb = m_bb + zd;
                if (mbb < 0)
                {
                    continue;
                }
                else if (mbb > m_limit)
                {
                    break;
                }

                for (int ydi = 0; ydi < scan_delta_size; ydi++)
                {
                    const int yd = m_pParams->m_pScan_deltas[ydi];
                    const int mbg = m_bg + yd;
                    if (mbg < 0)
                    {
                        continue;
                    }
                    else if (mbg > m_limit)
                    {
                        break;
                    }

                    for (int xdi = 0; xdi < scan_delta_size; xdi++)
                    {
                        const int xd = m_pParams->m_pScan_deltas[xdi];
                        const int mbr = m_br + xd;
                        if (mbr < 0)
                        {
                            continue;
                        }
                        else if (mbr > m_limit)
                        {
                            break;
                        }

                        etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
                        if (m_pParams->m_quality == cHighQuality)
                        {
                            if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
                            {
                                continue;
                            }
                        }
                        else
                        {
                            if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
                            {
                                continue;
                            }
                        }

                        // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
                        // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
                        // The goal is:
                        // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
                        // Rearranging this:
                        // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
                        // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
                        // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
                        // So what this means:
                        // optimal_block_color = avg_input - avg_inten_delta
                        // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
                        // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
                        // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

                        const uint max_refinement_trials = (m_pParams->m_quality == cLowQuality) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
                        for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
                        {
                            const uint8* pSelectors = m_best_solution.m_selectors;
                            const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

                            int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
                            const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
                            for (uint r = 0; r < n; r++)
                            {
                                const uint s = *pSelectors++;
                                const int yd = pInten_table[s];
                                // Compute actual delta being applied to each pixel, taking into account clamping.
                                delta_sum_r += rg_etc1::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
                                delta_sum_g += rg_etc1::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
                                delta_sum_b += rg_etc1::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
                            }
                            if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
                            {
                                break;
                            }
                            const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
                            const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
                            const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
                            const int br1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
                            const int bg1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
                            const int bb1 = rg_etc1::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

                            bool skip = false;

                            if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
                            {
                                skip = true;
                            }
                            else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
                            {
                                skip = true;
                            }
                            else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
                            {
                                skip = true;
                            }

                            if (skip)
                            {
                                break;
                            }

                            etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
                            if (m_pParams->m_quality == cHighQuality)
                            {
                                if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
                                {
                                    break;
                                }
                            }
                            else
                            {
                                if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
                                {
                                    break;
                                }
                            }

                        } // refinement_trial

                    } // xdi
                } // ydi
            } // zdi

            if (!m_best_solution.m_valid)
            {
                m_pResult->m_error = cUINT32_MAX;
                return false;
            }

            const uint8* pSelectors = m_best_solution.m_selectors;

#ifdef RG_ETC1_BUILD_DEBUG
            {
                color_quad_u8 block_colors[4];
                m_best_solution.m_coords.get_block_colors(block_colors);

                const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
                uint64 actual_error = 0;
                for (uint i = 0; i < n; i++)
                    actual_error += pSrc_pixels[i].squared_distance_rgb(block_colors[pSelectors[i]]);

                RG_ETC1_ASSERT(actual_error == m_best_solution.m_error);
            }
#endif

            m_pResult->m_error = m_best_solution.m_error;

            m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
            m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

            m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
            memcpy(m_pResult->m_pSelectors, pSelectors, n);
            m_pResult->m_n = n;

            return true;
        }